

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::reactive_socket_service
          (reactive_socket_service<asio::ip::tcp> *this,execution_context *context)

{
  reactor *prVar1;
  error_category *peVar2;
  key local_28;
  
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service.key_.type_info_ = (type_info *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service.key_.id_ = (id *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service.owner_ = context;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service.next_ = (service *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_00620080;
  local_28.type_info_ = (type_info *)&typeid_wrapper<asio::detail::epoll_reactor>::typeinfo;
  local_28.id_ = (id *)0x0;
  prVar1 = (reactor *)
           service_registry::do_use_service
                     (context->service_registry_,&local_28,
                      service_registry::create<asio::detail::epoll_reactor,asio::execution_context>,
                      context->service_registry_->owner_);
  (this->super_reactive_socket_service_base).reactor_ = prVar1;
  (this->super_reactive_socket_service_base).success_ec_._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  (this->super_reactive_socket_service_base).success_ec_._M_cat = peVar2;
  scheduler::init_task(prVar1->scheduler_);
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_0061fff0;
  return;
}

Assistant:

reactive_socket_service(execution_context& context)
    : execution_context_service_base<
        reactive_socket_service<Protocol> >(context),
      reactive_socket_service_base(context)
  {
  }